

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O3

void Abc_NodeMffcConeSupp_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vCone,Vec_Ptr_t *vSupp,int fTopmost)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  uint uVar5;
  void **ppvVar6;
  int Fill;
  long lVar7;
  int *piVar8;
  
  pAVar3 = pNode->pNtk;
  iVar1 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,(int)vSupp);
  if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pNode->pNtk;
  iVar2 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
    iVar1 = pNode->Id;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar4->vTravIds).pArray[iVar1] = iVar2;
    if ((fTopmost == 0) &&
       (((uVar5 = *(uint *)&pNode->field_0x14 & 0xf, uVar5 == 2 || (uVar5 == 5)) ||
        (0 < (pNode->vFanouts).nSize)))) {
      if (vSupp == (Vec_Ptr_t *)0x0) {
        return;
      }
      piVar8 = &vSupp->nSize;
      uVar5 = vSupp->nSize;
      if (uVar5 == vSupp->nCap) {
        if ((int)uVar5 < 0x10) {
          if (vSupp->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vSupp->pArray,0x80);
          }
          vSupp->pArray = ppvVar6;
          vSupp->nCap = 0x10;
        }
        else {
          if (vSupp->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vSupp->pArray,(ulong)uVar5 << 4);
          }
          vSupp->pArray = ppvVar6;
          vSupp->nCap = uVar5 * 2;
        }
      }
      else {
        ppvVar6 = vSupp->pArray;
      }
    }
    else {
      if (0 < (pNode->vFanins).nSize) {
        lVar7 = 0;
        do {
          Abc_NodeMffcConeSupp_rec
                    ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar7]],vCone,
                     vSupp,0);
          lVar7 = lVar7 + 1;
        } while (lVar7 < (pNode->vFanins).nSize);
      }
      if (vCone == (Vec_Ptr_t *)0x0) {
        return;
      }
      piVar8 = &vCone->nSize;
      uVar5 = vCone->nSize;
      if (uVar5 == vCone->nCap) {
        if ((int)uVar5 < 0x10) {
          if (vCone->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vCone->pArray,0x80);
          }
          vCone->pArray = ppvVar6;
          vCone->nCap = 0x10;
        }
        else {
          if (vCone->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vCone->pArray,(ulong)uVar5 << 4);
          }
          vCone->pArray = ppvVar6;
          vCone->nCap = uVar5 * 2;
        }
      }
      else {
        ppvVar6 = vCone->pArray;
      }
    }
    iVar1 = *piVar8;
    *piVar8 = iVar1 + 1;
    ppvVar6[iVar1] = pNode;
  }
  return;
}

Assistant:

void Abc_NodeMffcConeSupp_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vCone, Vec_Ptr_t * vSupp, int fTopmost )
{
    Abc_Obj_t * pFanin;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    // add to the new support nodes
    if ( !fTopmost && (Abc_ObjIsCi(pNode) || pNode->vFanouts.nSize > 0) )
    {
        if ( vSupp ) Vec_PtrPush( vSupp, pNode );
        return;
    }
    // recur on the children
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_NodeMffcConeSupp_rec( pFanin, vCone, vSupp, 0 );
    // collect the internal node
    if ( vCone ) Vec_PtrPush( vCone, pNode );
//    printf( "%d ", pNode->Id );
}